

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfontenginemultifontconfig.cpp
# Opt level: O2

FcPattern * __thiscall
QFontEngineMultiFontConfig::getMatchPatternForFallback
          (QFontEngineMultiFontConfig *this,int fallBackIndex)

{
  undefined8 uVar1;
  char *pcVar2;
  parameter_type t;
  long size;
  long in_FS_OFFSET;
  FcResult result;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  size = (long)(int)(this->super_QFontEngineMulti).m_fallbackFamilies.d.size;
  if ((this->cachedMatchPatterns).d.size < size) {
    QList<_FcPattern_*>::resize(&this->cachedMatchPatterns,size);
  }
  t = (this->cachedMatchPatterns).d.ptr[fallBackIndex];
  if (t == (parameter_type)0x0) {
    uVar1 = FcPatternCreate();
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
    QFontEngineMulti::fallbackFamilyAt
              ((QString *)&result,&this->super_QFontEngineMulti,fallBackIndex);
    QString::toUtf8_helper((QString *)&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&result);
    pcVar2 = QByteArray::data((QByteArray *)&local_58);
    FcPatternAdd(uVar1,"family",3,pcVar2,1);
    result = 0xaaaaaaaa;
    t = (parameter_type)FcFontMatch(0,uVar1,&result);
    QList<_FcPattern_*>::insert(&this->cachedMatchPatterns,(long)fallBackIndex,t);
    FcPatternDestroy(uVar1);
    QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return t;
  }
  __stack_chk_fail();
}

Assistant:

FcPattern * QFontEngineMultiFontConfig::getMatchPatternForFallback(int fallBackIndex) const
{
    Q_ASSERT(fallBackIndex < fallbackFamilyCount());
    if (fallbackFamilyCount() > cachedMatchPatterns.size())
        cachedMatchPatterns.resize(fallbackFamilyCount());
    FcPattern *ret = cachedMatchPatterns.at(fallBackIndex);
    if (ret)
        return ret;
    FcPattern *requestPattern = FcPatternCreate();
    FcValue value;
    value.type = FcTypeString;
    QByteArray cs = fallbackFamilyAt(fallBackIndex).toUtf8();
    value.u.s = reinterpret_cast<const FcChar8 *>(cs.data());
    FcPatternAdd(requestPattern, FC_FAMILY, value, true);
    FcResult result;
    ret = FcFontMatch(nullptr, requestPattern, &result);
    cachedMatchPatterns.insert(fallBackIndex, ret);
    FcPatternDestroy(requestPattern);
    return ret;
}